

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

void split_node(dtree_t *tr,uint32 node_id,float32 ****mixw,float32 ****means,float32 ****vars,
               uint32 *veclen,uint32 n_model,uint32 n_state,uint32 n_stream,uint32 n_density,
               float32 *stwt,quest_t *all_q,uint32 n_all_q,pset_t *pset,uint32 **dfeat,
               uint32 n_dfeat,float32 mwfloor)

{
  dtree_node_t *pdVar1;
  dtree_node_t *pdVar2;
  uint32 *puVar3;
  int iVar4;
  uint32 *id;
  uint32 *id_00;
  uint uVar5;
  ulong uVar6;
  size_t n_elem;
  ulong uVar7;
  uint32 n_id;
  ulong uVar8;
  uint uVar9;
  uint32 n_model_00;
  undefined8 in_stack_ffffffffffffff58;
  quest_t *pqVar10;
  uint local_74;
  
  pdVar2 = tr->node;
  pdVar1 = pdVar2 + node_id;
  puVar3 = pdVar2[node_id].id;
  uVar7 = (ulong)pdVar2[node_id].n_id;
  uVar6 = 0;
  if (uVar7 == 0) {
    n_elem = 0;
  }
  else {
    uVar8 = 0;
    uVar9 = 0;
    do {
      iVar4 = eval_quest((quest_t *)pdVar1->q,dfeat[puVar3[uVar8]],n_dfeat);
      uVar9 = uVar9 + (iVar4 == 0);
      uVar5 = (int)uVar6 + (uint)(iVar4 != 0);
      uVar6 = (ulong)uVar5;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
    n_elem = (size_t)uVar5;
    uVar6 = (ulong)uVar9;
  }
  id = (uint32 *)
       __ckd_calloc__(n_elem,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                      ,0x480);
  id_00 = (uint32 *)
          __ckd_calloc__(uVar6,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                         ,0x481);
  n_model_00 = (uint32)in_stack_ffffffffffffff58;
  if (uVar7 == 0) {
    local_74 = 0;
    n_id = 0;
  }
  else {
    uVar6 = 0;
    uVar8 = 0;
    local_74 = 0;
    do {
      uVar9 = puVar3[uVar6];
      iVar4 = eval_quest((quest_t *)pdVar1->q,dfeat[uVar9],n_dfeat);
      n_model_00 = (uint32)in_stack_ffffffffffffff58;
      if (iVar4 == 0) {
        id_00[local_74] = uVar9;
        local_74 = local_74 + 1;
      }
      else {
        id[uVar8] = uVar9;
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      n_id = (uint32)uVar8;
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  uVar9 = tr->n_node;
  uVar5 = uVar9 + 1;
  tr->n_node = uVar9 + 2;
  pdVar2 = tr->node;
  pdVar1->y = pdVar2 + uVar9;
  pdVar1->n = pdVar2 + uVar5;
  pdVar2[uVar9].p = pdVar1;
  pdVar2[uVar5].p = pdVar1;
  mk_node(pdVar2 + uVar9,uVar9,id,n_id,mixw,means,vars,veclen,n_model_00,n_state,n_stream,n_density,
          stwt,mwfloor);
  pqVar10 = all_q;
  set_best_quest(pdVar1->y,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,all_q,
                 n_all_q,pset,dfeat,n_dfeat,mwfloor);
  mk_node(pdVar1->n,uVar5,id_00,local_74,mixw,means,vars,veclen,(uint32)pqVar10,n_state,n_stream,
          n_density,stwt,mwfloor);
  set_best_quest(pdVar1->n,mixw,means,vars,veclen,n_model,n_state,n_stream,n_density,stwt,all_q,
                 n_all_q,pset,dfeat,n_dfeat,mwfloor);
  return;
}

Assistant:

void
split_node(dtree_t *tr,
	   uint32 node_id,
	   float32 ****mixw,
           float32 ****means,
           float32 ****vars,
           uint32 *veclen,
	   uint32 n_model,
	   uint32 n_state,
	   uint32 n_stream,
	   uint32 n_density,
	   float32 *stwt,

	   quest_t *all_q,
	   uint32 n_all_q,
	   pset_t *pset,
	   
	   uint32 **dfeat,
	   uint32 n_dfeat,

	   float32 mwfloor)
{
    uint32 *id, n_id;
    uint32 *id_yes, n_yes;
    uint32 *id_no, n_no;
    dtree_node_t *node;
    uint32 node_id_yes;
    uint32 node_id_no;
    uint32 ii, i;

    node = &tr->node[node_id];

    id = node->id;
    n_id = node->n_id;

    for (ii = 0, n_yes = 0, n_no = 0; ii < n_id; ii++) {
	i = id[ii];

	if (eval_quest((quest_t *)node->q, dfeat[i], n_dfeat)) {
	    ++n_yes;
	}
	else {
	    ++n_no;
	}
    }

#if 0
    fprintf(stderr, "Split: (");
    print_quest(stderr, pset, (quest_t *)node->q);
    fprintf(stderr, ") %u/%u %.3e\n", n_yes, n_no, node->wt_ent_dec);
#endif

    id_yes = ckd_calloc(n_yes, sizeof(uint32));
    id_no = ckd_calloc(n_no, sizeof(uint32));

    for (ii = 0, n_yes = 0, n_no = 0; ii < n_id; ii++) {
	i = id[ii];

	if (eval_quest((quest_t *)node->q, dfeat[i], n_dfeat)) {
	    id_yes[n_yes] = i;
	    ++n_yes;
	}
	else {
	    id_no[n_no] = i;
	    ++n_no;
	}
    }

    node_id_yes = tr->n_node++;
    node_id_no = tr->n_node++;

    node->y = &tr->node[node_id_yes];
    node->n = &tr->node[node_id_no];
    node->y->p = node;
    node->n->p = node;

    mk_node(node->y,
	    node_id_yes,
	    id_yes, n_yes,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    set_best_quest(node->y,
		   mixw,
                   means,
                   vars,
                   veclen,
		   n_model,
		   n_state,
		   n_stream,
		   n_density,
		   stwt,
		   all_q, n_all_q, pset,
		   dfeat, n_dfeat,
		   mwfloor);

    mk_node(node->n,
	    node_id_no,
	    id_no, n_no,
	    mixw, means, vars, veclen,
            n_model, n_state, n_stream, n_density, stwt, mwfloor);

    set_best_quest(node->n,
		   mixw,
                   means,
                   vars,
                   veclen,
		   n_model,
		   n_state,
		   n_stream,
		   n_density,
		   stwt,
		   all_q, n_all_q, pset,
		   dfeat, n_dfeat,
		   mwfloor);
}